

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2configuration.cpp
# Opt level: O3

bool __thiscall QHttp2Configuration::setMaxFrameSize(QHttp2Configuration *this,uint size)

{
  QHttp2ConfigurationPrivate *pQVar1;
  QLoggingCategory *this_00;
  
  if (size - 0x4000 < 0xffc000) {
    pQVar1 = (this->d).d.ptr;
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QHttp2ConfigurationPrivate>::detach_helper(&this->d);
      pQVar1 = (this->d).d.ptr;
    }
    pQVar1->maxFrameSize = size;
  }
  else {
    this_00 = QtPrivateLogging::QT_HTTP2();
    if (((this_00->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      setMaxFrameSize((QHttp2Configuration *)this_00);
    }
  }
  return size - 0x4000 < 0xffc000;
}

Assistant:

bool QHttp2Configuration::setMaxFrameSize(unsigned size)
{
    if (size < Http2::minPayloadLimit || size > Http2::maxPayloadSize) {
        qCWarning(QT_HTTP2) << "Maximum frame size to advertise is invalid";
        return false;
    }

    d->maxFrameSize = size;
    return true;
}